

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnInitExprF64ConstExpr
          (BinaryReaderLogging *this,Index index,uint64_t value_bits)

{
  Enum EVar1;
  double value;
  uint64_t value_bits_local;
  Index index_local;
  BinaryReaderLogging *this_local;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnInitExprF64ConstExpr(index: %u value: %g (0x08%lx))\n",value_bits,
                 (ulong)index,value_bits);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0xcb])(this->reader_,(ulong)index,value_bits);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnInitExprF64ConstExpr(Index index,
                                                   uint64_t value_bits) {
  double value;
  memcpy(&value, &value_bits, sizeof(value));
  LOGF("OnInitExprF64ConstExpr(index: %" PRIindex " value: %g (0x08%" PRIx64
       "))\n",
       index, value, value_bits);
  return reader_->OnInitExprF64ConstExpr(index, value_bits);
}